

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZReschedulableTask.cpp
# Opt level: O1

void __thiscall TPZReschedulableTask::start(TPZReschedulableTask *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &this->mStateMutex;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  if ((int)(this->super_TPZTask).mState < 2) {
    (*(this->super_TPZTask)._vptr_TPZTask[4])(this);
    std::unique_lock<std::mutex>::~unique_lock(&local_20);
    std::condition_variable::notify_all();
  }
  else {
    std::unique_lock<std::mutex>::~unique_lock(&local_20);
  }
  return;
}

Assistant:

void TPZReschedulableTask::start() {
    bool executed = false;
    {
        std::unique_lock<std::mutex> lock(mStateMutex);
        if (mState <= TPZReschedulableTask::SCHEDULED) {
            this->startInternal();
            executed = true;
        }
    }
    if (executed) {
        mCondition.notify_all();
    }
}